

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

short * __thiscall delay_line<short>::input_buffer(delay_line<short> *this,uint32_t frames_needed)

{
  size_t sVar1;
  short *psVar2;
  uint in_ESI;
  auto_array<short> *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  auto_array<short> *this_00;
  
  this_00 = in_RDI;
  sVar1 = auto_array<short>::length((auto_array<short> *)&in_RDI->length_);
  *(int *)&in_RDI->capacity_ = (int)sVar1;
  processor::frames_to_samples((processor *)in_RDI,(ulong)in_ESI);
  auto_array<short>::reserve(this_00,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  psVar2 = auto_array<short>::data((auto_array<short> *)&in_RDI->length_);
  return psVar2 + (uint)in_RDI->capacity_;
}

Assistant:

T * input_buffer(uint32_t frames_needed)
  {
    leftover_samples = delay_input_buffer.length();
    delay_input_buffer.reserve(leftover_samples +
                               frames_to_samples(frames_needed));
    return delay_input_buffer.data() + leftover_samples;
  }